

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O1

bool Diligent::VerifyResourceState(RESOURCE_STATE States,COMMAND_QUEUE_TYPE QueueType,char *Name)

{
  COMMAND_QUEUE_TYPE CVar1;
  COMMAND_QUEUE_TYPE CVar2;
  char cVar3;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE Type_00;
  COMMAND_QUEUE_TYPE Type_01;
  undefined7 in_register_00000031;
  COMMAND_QUEUE_TYPE CVar4;
  bool bVar5;
  bool bVar6;
  RESOURCE_STATE State;
  bool bVar8;
  bool bVar9;
  string msg;
  undefined5 in_stack_ffffffffffffff78;
  string local_80;
  Char *local_60;
  String local_58;
  uint local_34;
  bool bVar7;
  
  if (States == RESOURCE_STATE_UNKNOWN) {
    bVar6 = true;
  }
  else {
    local_34 = (uint)CONCAT71(in_register_00000031,QueueType);
    CVar4 = QueueType & COMMAND_QUEUE_TYPE_GRAPHICS;
    bVar8 = Name != (char *)0x0;
    CVar2 = QueueType & COMMAND_QUEUE_TYPE_COMPUTE;
    cVar3 = CVar2 == COMMAND_QUEUE_TYPE_COMPUTE || bVar8;
    CVar1 = bVar8 | QueueType;
    bVar5 = true;
    bVar7 = true;
    bVar6 = true;
    do {
      State = -States & States;
      if (0x7ff < (int)State) {
        if ((int)State < 0x10000) {
          if ((int)State < 0x2000) {
            if ((State == RESOURCE_STATE_COPY_DEST) || (State == RESOURCE_STATE_COPY_SOURCE))
            goto switchD_0068bc95_caseD_1;
          }
          else if ((State == RESOURCE_STATE_RESOLVE_DEST) ||
                  ((State == RESOURCE_STATE_RESOLVE_SOURCE ||
                   (State == RESOURCE_STATE_INPUT_ATTACHMENT)))) goto switchD_0068bc95_caseD_2;
          goto switchD_0068bc95_caseD_3;
        }
        if ((int)State < 0x80000) {
          if (State != RESOURCE_STATE_PRESENT) {
            if ((State != RESOURCE_STATE_BUILD_AS_READ) && (State != RESOURCE_STATE_BUILD_AS_WRITE))
            goto switchD_0068bc95_caseD_3;
            goto switchD_0068bc95_caseD_4;
          }
        }
        else {
          if (State == RESOURCE_STATE_RAY_TRACING) goto switchD_0068bc95_caseD_4;
          if (State != RESOURCE_STATE_MAX_BIT) {
            if (State == RESOURCE_STATE_COMMON) goto switchD_0068bc95_caseD_1;
            goto switchD_0068bc95_caseD_3;
          }
        }
        goto switchD_0068bc95_caseD_2;
      }
      if (0x3f < (int)State) {
        if (0xff < (int)State) {
          if (State != RESOURCE_STATE_SHADER_RESOURCE) {
            if (State == RESOURCE_STATE_STREAM_OUT) goto switchD_0068bc95_caseD_2;
            if (State != RESOURCE_STATE_INDIRECT_ARGUMENT) goto switchD_0068bc95_caseD_3;
          }
          goto switchD_0068bc95_caseD_4;
        }
        if ((State != RESOURCE_STATE_DEPTH_WRITE) && (State != RESOURCE_STATE_DEPTH_READ))
        goto switchD_0068bc95_caseD_3;
        goto switchD_0068bc95_caseD_2;
      }
      switch(State) {
      case RESOURCE_STATE_UNDEFINED:
switchD_0068bc95_caseD_1:
        bVar6 = bVar5;
        if ((local_34 & 1) == 0) {
          bVar6 = false;
        }
        bVar7 = bVar6;
        bVar5 = bVar6;
        if ((CVar1 & COMMAND_QUEUE_TYPE_TRANSFER) != COMMAND_QUEUE_TYPE_UNKNOWN) break;
        local_60 = GetResourceStateFlagString(State);
        GetCommandQueueTypeString_abi_cxx11_(&local_58,(Diligent *)(ulong)CVar4,Type_01);
        FormatString<char[17],char_const*,char[27],std::__cxx11::string,char[9]>
                  (&local_80,(Diligent *)" contains state ",(char (*) [17])&local_60,
                   (char **)" that is not supported in ",(char (*) [27])&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x836d54,
                   (char (*) [9])
                   CONCAT17(CVar2,CONCAT16(cVar3,CONCAT15(CVar1,in_stack_ffffffffffffff78))));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        DebugAssertionFailed
                  (local_80._M_dataplus._M_p,"VerifyResourceState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x177);
        goto LAB_0068bf74;
      case RESOURCE_STATE_VERTEX_BUFFER|RESOURCE_STATE_UNDEFINED:
      case RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_UNDEFINED:
      case RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_VERTEX_BUFFER:
      case RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_VERTEX_BUFFER|RESOURCE_STATE_UNDEFINED:
switchD_0068bc95_caseD_3:
        FormatString<char[26]>(&local_80,(char (*) [26])"Unexpected resource state");
        DebugAssertionFailed
                  (local_80._M_dataplus._M_p,"VerifyResourceState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x19c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        break;
      case RESOURCE_STATE_CONSTANT_BUFFER:
switchD_0068bc95_caseD_4:
        bVar6 = bVar7;
        if (CVar2 != COMMAND_QUEUE_TYPE_COMPUTE) {
          bVar5 = false;
          bVar6 = false;
        }
        bVar7 = bVar6;
        if (cVar3 == '\0') {
          local_60 = GetResourceStateFlagString(State);
          GetCommandQueueTypeString_abi_cxx11_(&local_58,(Diligent *)(ulong)CVar4,Type);
          FormatString<char[17],char_const*,char[27],std::__cxx11::string,char[9]>
                    (&local_80,(Diligent *)" contains state ",(char (*) [17])&local_60,
                     (char **)" that is not supported in ",(char (*) [27])&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x836d54,
                     (char (*) [9])
                     CONCAT17(CVar2,CONCAT16(cVar3,CONCAT15(CVar1,in_stack_ffffffffffffff78))));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          DebugAssertionFailed
                    (local_80._M_dataplus._M_p,"VerifyResourceState",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x185);
          goto LAB_0068bf74;
        }
        break;
      default:
        if (State != RESOURCE_STATE_RENDER_TARGET) {
          if (State == RESOURCE_STATE_UNORDERED_ACCESS) goto switchD_0068bc95_caseD_4;
          goto switchD_0068bc95_caseD_3;
        }
      case RESOURCE_STATE_VERTEX_BUFFER:
      case RESOURCE_STATE_INDEX_BUFFER:
switchD_0068bc95_caseD_2:
        bVar6 = bVar7;
        if (CVar4 != COMMAND_QUEUE_TYPE_GRAPHICS) {
          bVar5 = false;
          bVar6 = false;
        }
        bVar7 = bVar6;
        if (CVar4 != COMMAND_QUEUE_TYPE_GRAPHICS && !bVar8) {
          local_60 = GetResourceStateFlagString(State);
          GetCommandQueueTypeString_abi_cxx11_(&local_58,(Diligent *)(ulong)CVar4,Type_00);
          FormatString<char[17],char_const*,char[27],std::__cxx11::string,char[9]>
                    (&local_80,(Diligent *)" contains state ",(char (*) [17])&local_60,
                     (char **)" that is not supported in ",(char (*) [27])&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x836d54,
                     (char (*) [9])
                     CONCAT17(CVar2,CONCAT16(cVar3,CONCAT15(CVar1,in_stack_ffffffffffffff78))));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          DebugAssertionFailed
                    (local_80._M_dataplus._M_p,"VerifyResourceState",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x197);
LAB_0068bf74:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          bVar6 = false;
          bVar7 = false;
          bVar5 = false;
        }
      }
      bVar9 = State != States;
      States = State ^ States;
    } while (bVar9);
  }
  return bVar6;
}

Assistant:

bool VerifyResourceState(RESOURCE_STATE States, COMMAND_QUEUE_TYPE QueueType, const char* Name)
{
    QueueType &= COMMAND_QUEUE_TYPE_PRIMARY_MASK;

    bool Result = true;
    while (States != 0)
    {
        RESOURCE_STATE State = ExtractLSB(States);

        static_assert(RESOURCE_STATE_MAX_BIT == (1u << 21), "Please update the switch below to handle the new resource state");
        switch (State)
        {
            case RESOURCE_STATE_UNDEFINED:
            case RESOURCE_STATE_COPY_DEST:
            case RESOURCE_STATE_COPY_SOURCE:
            case RESOURCE_STATE_COMMON:
                if ((QueueType & COMMAND_QUEUE_TYPE_TRANSFER) != COMMAND_QUEUE_TYPE_TRANSFER)
                {
                    Result = false;
                    CHECK_PARAMETER(Name, " contains state ", GetResourceStateFlagString(State), " that is not supported in ", GetCommandQueueTypeString(QueueType), " context");
                }
                break;

            case RESOURCE_STATE_CONSTANT_BUFFER:
            case RESOURCE_STATE_UNORDERED_ACCESS:
            case RESOURCE_STATE_SHADER_RESOURCE:
            case RESOURCE_STATE_INDIRECT_ARGUMENT:
            case RESOURCE_STATE_BUILD_AS_READ:
            case RESOURCE_STATE_BUILD_AS_WRITE:
            case RESOURCE_STATE_RAY_TRACING:
                if ((QueueType & COMMAND_QUEUE_TYPE_COMPUTE) != COMMAND_QUEUE_TYPE_COMPUTE)
                {
                    Result = false;
                    CHECK_PARAMETER(Name, " contains state ", GetResourceStateFlagString(State), " that is not supported in ", GetCommandQueueTypeString(QueueType), " context");
                }
                break;

            case RESOURCE_STATE_VERTEX_BUFFER:
            case RESOURCE_STATE_INDEX_BUFFER:
            case RESOURCE_STATE_RENDER_TARGET:
            case RESOURCE_STATE_DEPTH_WRITE:
            case RESOURCE_STATE_DEPTH_READ:
            case RESOURCE_STATE_STREAM_OUT:
            case RESOURCE_STATE_RESOLVE_DEST:
            case RESOURCE_STATE_RESOLVE_SOURCE:
            case RESOURCE_STATE_INPUT_ATTACHMENT:
            case RESOURCE_STATE_PRESENT:
            case RESOURCE_STATE_SHADING_RATE:
                if ((QueueType & COMMAND_QUEUE_TYPE_GRAPHICS) != COMMAND_QUEUE_TYPE_GRAPHICS)
                {
                    Result = false;
                    CHECK_PARAMETER(Name, " contains state ", GetResourceStateFlagString(State), " that is not supported in ", GetCommandQueueTypeString(QueueType), " context");
                }
                break;

            default:
                UNEXPECTED("Unexpected resource state");
                break;
        }
    }
    return Result;
}